

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckStructure.cpp
# Opt level: O1

bool __thiscall CheckStructure::isType(CheckStructure *this,string *begin)

{
  pointer pbVar1;
  pointer pcVar2;
  size_t __n;
  int iVar3;
  pointer pbVar4;
  bool bVar5;
  bool bVar6;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->m_coutTypes = this->m_coutTypes + 1;
  pbVar4 = (this->types).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->types).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = pbVar4 != pbVar1;
  if (bVar5) {
    do {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pcVar2 = (pbVar4->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + pbVar4->_M_string_length);
      __n = begin->_M_string_length;
      if (__n == local_50._M_string_length) {
        if (__n == 0) {
          bVar6 = true;
        }
        else {
          iVar3 = bcmp((begin->_M_dataplus)._M_p,local_50._M_dataplus._M_p,__n);
          bVar6 = iVar3 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if (bVar6) {
        if (this->m_coutTypes == 1) {
          std::__cxx11::string::_M_assign((string *)this);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if (bVar6) {
          if (bVar5 != false) {
            return bVar5;
          }
          break;
        }
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      pbVar4 = pbVar4 + 1;
      bVar5 = pbVar4 != pbVar1;
    } while (bVar5);
  }
  iVar3 = std::__cxx11::string::compare((char *)begin);
  if (iVar3 == 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"missed type of main()","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->m_errors,
               &local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    this->m_countCalls = this->m_countCalls + 1;
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Wrong type of main()","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->m_errors,
               &local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    this->m_fWrongType = true;
  }
  return bVar5;
}

Assistant:

bool CheckStructure::isType(string begin) {
    m_coutTypes++;
    for (string str : types) {
        if (begin == str) {
            if (m_coutTypes == 1)
                m_sMainType = str;
            return true;
        }
    }
    if (begin == "main") {
        m_errors.push_back("missed type of main()");
        m_countCalls++;
        return false;
    } else {
        m_errors.push_back("Wrong type of main()");
        m_fWrongType = true;
    }
    return false;
}